

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_connect_op.hpp
# Opt level: O0

void __thiscall
asio::detail::
reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>::
reactive_socket_connect_op
          (reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
           *this,error_code *success_ec,socket_type socket,
          function<void_(const_std::error_code_&)> *handler,any_io_executor *io_ex)

{
  reactive_socket_connect_op_base *in_RCX;
  function<void_(const_std::error_code_&)> *in_RDI;
  error_code *in_R8;
  function<void_(const_std::error_code_&)> *in_stack_ffffffffffffffc8;
  
  reactive_socket_connect_op_base::reactive_socket_connect_op_base
            (in_RCX,in_R8,(socket_type)((ulong)in_RDI >> 0x20),(func_type)in_stack_ffffffffffffffc8)
  ;
  std::function<void_(const_std::error_code_&)>::function(in_RDI,in_stack_ffffffffffffffc8);
  handler_work<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor,_void>::
  handler_work((handler_work<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor,_void>
                *)in_RDI,in_stack_ffffffffffffffc8,(any_io_executor *)0x7234f8);
  return;
}

Assistant:

reactive_socket_connect_op(const asio::error_code& success_ec,
      socket_type socket, Handler& handler, const IoExecutor& io_ex)
    : reactive_socket_connect_op_base(success_ec, socket,
        &reactive_socket_connect_op::do_complete),
      handler_(static_cast<Handler&&>(handler)),
      work_(handler_, io_ex)
  {
  }